

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O2

void __thiscall
ElementsTransactionApi_FundRawTransaction_prod_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_prod_Test *this)

{
  uint32_t uVar1;
  char *pcVar2;
  long lVar3;
  Amount AVar4;
  initializer_list<cfd::UtxoData> __l;
  string local_2248;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  UtxoFilter filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ConfidentialAssetId asset2;
  ConfidentialAssetId asset1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ConfidentialAssetId fee_asset;
  AssertionResult gtest_ar;
  UtxoData local_19f8;
  UtxoData local_14d0;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kLiquidV1);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d",
             (allocator *)&utxo1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset1,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7",
             (allocator *)&utxo1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 2;
  std::__cxx11::string::string
            ((string *)&utxo2,"0014860d7bed1010c2ccb5247889daa5c58023fa9f8d",(allocator *)&utxo3);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2",(allocator *)&utxo3);
  cfd::AddressFactory::GetAddress
            ((Address *)&gtest_ar,&factory.super_AddressFactory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,0xf4177);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo1.asset,&asset1);
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06",
             (allocator *)&txc);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo3,"0014891fd3ada0038759b124189ed64ab2343f7de0b1",(allocator *)&txc);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo3);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&utxo3,"ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9",(allocator *)&txc);
  cfd::AddressFactory::GetAddress
            ((Address *)&gtest_ar,&factory.super_AddressFactory,(string *)&utxo3);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,19999);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo2.asset,&asset2);
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&txc,"376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988",
             (allocator *)&option);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&txc);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  utxo3.vout = 2;
  std::__cxx11::string::string
            ((string *)&txc,"001495f728a019f3ecc3725479b32b230de51df74d4a",(allocator *)&option);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&txc);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  std::__cxx11::string::string
            ((string *)&txc,"ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6",(allocator *)&option);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory.super_AddressFactory,(string *)&txc)
  ;
  cfd::core::Address::operator=(&utxo3.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&txc);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,1);
  utxo3.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo3.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&utxo3.asset,&asset2);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,&asset1);
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&asset1);
  cfd::core::Amount::Amount((Amount *)&txc);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (Amount *)&txc);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&asset2);
  cfd::core::Amount::Amount((Amount *)&txc);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (Amount *)&txc);
  std::__cxx11::string::~string((string *)&gtest_ar);
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&asset1);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,char_const(&)[102]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (char (*) [102])
             "lq1qqgv5wwfp4h0pfnyy2kkxl0kg3qnahcpfq7emrxu9xusz879axq0spg9cxu8wf72ktsft5r8vxnkfd8s5kmg32fvy8texp5p6s"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&asset2);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,char_const(&)[102]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (char (*) [102])
             "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&estimate_fee);
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&option,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&fee_asset);
  cfd::CoinSelectionOption::SetBlindInfo(&option,0,0x34);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange(&option,0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000"
             ,(allocator *)&ctx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_19f8,&utxo2);
  cfd::UtxoData::UtxoData(&local_14d0,&utxo3);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&ctx);
  lVar3 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x528;
  } while (lVar3 != -0x528);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&txc)
  ;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&ctx,&api,(string *)&gtest_ar,&utxos,&map_target_value,&selected_txin_utxos,
             &reserve_txout_address,&fee_asset,true,0.11,&estimate_fee,&filter,&option,
             &append_txout_addresses,kCfdOutOfRangeError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            (&local_2248,&ctx.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&gtest_ar,&local_2248);
  cfd::ConfidentialTransactionContext::operator=(&txc,(ConfidentialTransactionContext *)&gtest_ar);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_2248);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctx);
  AVar4 = cfd::ConfidentialTransactionContext::GetFeeAmount(&txc,(ConfidentialAssetId *)0x0);
  ctx.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)AVar4.amount_;
  ctx.super_AbstractTransactionController.tx_address_._0_1_ = AVar4.ignore_check_;
  local_2248._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)&ctx);
  _api = cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2248,(long *)&api);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ctx);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)&ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&txc)
  ;
  testing::internal::CmpHelperSTREQ
            ((internal *)&ctx,"txc.GetHex().c_str()",
             "\"02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000\""
             ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)ctx.super_AbstractTransactionController._vptr_AbstractTransactionController == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)
        CONCAT71(ctx.super_AbstractTransactionController.tx_address_._1_7_,
                 ctx.super_AbstractTransactionController.tx_address_._0_1_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(ctx.super_AbstractTransactionController.tx_address_._1_7_,
                                  ctx.super_AbstractTransactionController.tx_address_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ctx.super_AbstractTransactionController.tx_address_);
  uVar1 = cfd::core::ConfidentialTransaction::GetVsize(&txc.super_ConfidentialTransaction);
  ctx.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)
       CONCAT44(ctx.super_AbstractTransactionController._vptr_AbstractTransactionController._4_4_,
                uVar1);
  local_2248._M_dataplus._M_p._0_4_ = 0x176;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txc.GetVsize()","374",(uint *)&ctx,(int *)&local_2248);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ctx);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)&ctx);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ctx);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&append_txout_addresses);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&selected_txin_utxos);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&reserve_txout_address._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&map_target_value._M_t);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset2);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset1);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_prod) {
  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);
  ConfidentialAssetId asset1("6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d");
  ConfidentialAssetId asset2("f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7");
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002");
  utxo1.vout = 2;
  utxo1.locking_script = Script("0014860d7bed1010c2ccb5247889daa5c58023fa9f8d");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2");
  utxo1.descriptor = "wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)";
  utxo1.amount = Amount(int64_t{999799});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = asset1;

  // Address2
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06");
  utxo2.vout = 0;
  utxo2.locking_script = Script("0014891fd3ada0038759b124189ed64ab2343f7de0b1");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9");
  utxo2.descriptor = "wpkh(023004f49c61a63e339fa554e218774d6b4752bbfcfca61fe1c567b96af196b524)";
  utxo2.amount = Amount(int64_t{19999});
  utxo2.address_type = AddressType::kP2wpkhAddress;
  utxo2.asset = asset2;

  // Address3
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988");
  utxo3.vout = 2;
  utxo3.locking_script = Script("001495f728a019f3ecc3725479b32b230de51df74d4a");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6");
  utxo3.descriptor = "wpkh(02272bcdbec1c0a2170e72f2d8cf42188d59ea7eae9296d60d435af3fe465d9bb5)";
  utxo3.amount = Amount(int64_t{1});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = asset2;

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = asset1;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(asset1.GetHex(), Amount());
  map_target_value.emplace(asset2.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(asset1.GetHex(), "lq1qqgv5wwfp4h0pfnyy2kkxl0kg3qnahcpfq7emrxu9xusz879axq0spg9cxu8wf72ktsft5r8vxnkfd8s5kmg32fvy8texp5p6s");
  reserve_txout_address.emplace(asset2.GetHex(), "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8");
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);
  option.SetKnapsackMinimumChange(0);

  ConfidentialTransactionContext txc("0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000");
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(txc.GetHex().c_str(), "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000");
  EXPECT_EQ(txc.GetVsize(), 374);
}